

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O2

void FDrawInfo::EndDrawInfo(void)

{
  FDrawInfo *di;
  long lVar1;
  
  di = gl_drawinfo;
  for (lVar1 = 0xe0; lVar1 != 0x3a0; lVar1 = lVar1 + 0x58) {
    GLDrawList::Reset((GLDrawList *)(&di->temporary + lVar1));
  }
  if (di->dldrawlists != (GLDrawList *)0x0) {
    for (lVar1 = 0; lVar1 != 0x2c0; lVar1 = lVar1 + 0x58) {
      GLDrawList::Reset((GLDrawList *)((long)&(di->dldrawlists->walls).Array + lVar1));
    }
  }
  gl_drawinfo = di->next;
  FDrawInfoList::Release(&di_list,di);
  return;
}

Assistant:

void FDrawInfo::EndDrawInfo()
{
	FDrawInfo * di = gl_drawinfo;

	for(int i=0;i<GLDL_TYPES;i++) di->drawlists[i].Reset();
	if (di->dldrawlists != NULL)
	{
		for (int i = 0; i < GLLDL_TYPES; i++) di->dldrawlists[i].Reset();
	}
	gl_drawinfo=di->next;
	di_list.Release(di);
}